

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode DataValue_encodeBinary(UA_DataValue *src,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_20;
  byte local_19;
  UA_StatusCode retval;
  UA_Byte encodingMask;
  UA_DataType *__local;
  UA_DataValue *src_local;
  
  local_19 = *(byte *)src & 1 | (*(byte *)src >> 1 & 1) << 1 | (*(byte *)src >> 2 & 1) << 2 |
             (*(byte *)src >> 3 & 1) << 3 | (*(byte *)src >> 4 & 1) << 4 |
             (*(byte *)src >> 5 & 1) << 5;
  _retval = _;
  __local = (UA_DataType *)src;
  local_20 = Byte_encodeBinary(&local_19,(UA_DataType *)0x0);
  if (((ulong)__local->typeName & 1) != 0) {
    UVar1 = Variant_encodeBinary((UA_Variant *)&__local->typeId,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  if ((*(byte *)&__local->typeName >> 1 & 1) != 0) {
    UVar1 = StatusCode_encodeBinary((UA_StatusCode *)&__local[1].typeId);
    local_20 = UVar1 | local_20;
  }
  if ((*(byte *)&__local->typeName >> 2 & 1) != 0) {
    UVar1 = DateTime_encodeBinary((UA_DateTime *)&__local[1].typeId.identifier.numeric);
    local_20 = UVar1 | local_20;
  }
  if ((*(byte *)&__local->typeName >> 4 & 1) != 0) {
    UVar1 = UInt16_encodeBinary((UA_UInt16 *)__local[1].typeId.identifier.guid.data4,
                                (UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  if ((*(byte *)&__local->typeName >> 3 & 1) != 0) {
    UVar1 = DateTime_encodeBinary((UA_DateTime *)&__local[1].memSize);
    local_20 = UVar1 | local_20;
  }
  if ((*(byte *)&__local->typeName >> 5 & 1) != 0) {
    UVar1 = UInt16_encodeBinary((UA_UInt16 *)&__local[1].members,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  return local_20;
}

Assistant:

static UA_StatusCode
DataValue_encodeBinary(UA_DataValue const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encodingMask = (UA_Byte)
        (src->hasValue | (src->hasStatus << 1) | (src->hasSourceTimestamp << 2) |
         (src->hasServerTimestamp << 3) | (src->hasSourcePicoseconds << 4) |
         (src->hasServerPicoseconds << 5));

    /* Encode the content */
    UA_StatusCode retval = Byte_encodeBinary(&encodingMask, NULL);
    if(src->hasValue)
        retval |= Variant_encodeBinary(&src->value, NULL);
    if(src->hasStatus)
        retval |= StatusCode_encodeBinary(&src->status);
    if(src->hasSourceTimestamp)
        retval |= DateTime_encodeBinary(&src->sourceTimestamp);
    if(src->hasSourcePicoseconds)
        retval |= UInt16_encodeBinary(&src->sourcePicoseconds, NULL);
    if(src->hasServerTimestamp)
        retval |= DateTime_encodeBinary(&src->serverTimestamp);
    if(src->hasServerPicoseconds)
        retval |= UInt16_encodeBinary(&src->serverPicoseconds, NULL);
    return retval;
}